

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::ExpressionVarVisitor::visit<slang::ast::NewCovergroupExpression>
          (ExpressionVarVisitor *this,NewCovergroupExpression *expr)

{
  ExpressionKind EVar1;
  bool bVar2;
  Symbol *pSVar3;
  Symbol *sym;
  NewCovergroupExpression *expr_local;
  ExpressionVarVisitor *this_local;
  
  EVar1 = (expr->super_Expression).kind;
  if (EVar1 == NamedValue || EVar1 == HierarchicalValue) {
    pSVar3 = Expression::getSymbolReference(&expr->super_Expression,true);
    if ((pSVar3 != (Symbol *)0x0) && (bVar2 = VariableSymbol::isKind(pSVar3->kind), bVar2)) {
      this->anyVars = true;
    }
  }
  else {
    NewCovergroupExpression::visitExprs<slang::ast::ExpressionVarVisitor&>(expr,this);
  }
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_base_of_v<Expression, T>) {
            switch (expr.kind) {
                case ExpressionKind::NamedValue:
                case ExpressionKind::HierarchicalValue: {
                    if (auto sym = expr.getSymbolReference()) {
                        if (VariableSymbol::isKind(sym->kind))
                            anyVars = true;
                    }
                    break;
                }
                default:
                    if constexpr (is_detected_v<ASTDetectors::visitExprs_t, T,
                                                ExpressionVarVisitor>) {
                        expr.visitExprs(*this);
                    }
                    break;
            }
        }
    }